

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_update_timer(Curl_multi *multi)

{
  CURLMcode CVar1;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  long timeout_ms;
  Curl_multi *multi_local;
  
  if ((multi->timer_cb != (curl_multi_timer_callback)0x0) &&
     (timeout_ms = (long)multi, CVar1 = multi_timeout(multi,&local_18), CVar1 == CURLM_OK)) {
    if (local_18 < 0) {
      if ((((0 < *(long *)(timeout_ms + 0x168)) || (*(long *)(timeout_ms + 0x168) < 0)) ||
          (0 < *(int *)(timeout_ms + 0x170))) || (*(int *)(timeout_ms + 0x170) < 0)) {
        *(time_t *)(timeout_ms + 0x168) = 0;
        *(undefined8 *)(timeout_ms + 0x170) = 0;
        (**(code **)(timeout_ms + 0x158))
                  (timeout_ms,0xffffffffffffffff,*(undefined8 *)(timeout_ms + 0x160));
      }
    }
    else {
      if (*(long *)(*(long *)(timeout_ms + 0xb0) + 0x20) < *(long *)(timeout_ms + 0x168)) {
        local_1c = 0xffffffff;
      }
      else {
        if (*(long *)(timeout_ms + 0x168) < *(long *)(*(long *)(timeout_ms + 0xb0) + 0x20)) {
          local_20 = 1;
        }
        else {
          if (*(int *)(*(long *)(timeout_ms + 0xb0) + 0x28) < *(int *)(timeout_ms + 0x170)) {
            local_24 = 0xffffffff;
          }
          else {
            local_24 = (uint)(*(int *)(timeout_ms + 0x170) <
                             *(int *)(*(long *)(timeout_ms + 0xb0) + 0x28));
          }
          local_20 = local_24;
        }
        local_1c = local_20;
      }
      if (local_1c != 0) {
        *(undefined8 *)(timeout_ms + 0x168) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x20);
        *(undefined8 *)(timeout_ms + 0x170) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x28);
        (**(code **)(timeout_ms + 0x158))(timeout_ms,local_18,*(undefined8 *)(timeout_ms + 0x160));
      }
    }
  }
  return;
}

Assistant:

void Curl_update_timer(struct Curl_multi *multi)
{
  long timeout_ms;

  if(!multi->timer_cb)
    return;
  if(multi_timeout(multi, &timeout_ms)) {
    return;
  }
  if(timeout_ms < 0) {
    static const struct curltime none = {0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      multi->timer_cb(multi, -1, multi->timer_userp);
      return;
    }
    return;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return;

  multi->timer_lastcall = multi->timetree->key;

  multi->timer_cb(multi, timeout_ms, multi->timer_userp);
}